

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

ES5ArrayTypeHandlerBase<unsigned_short> * __thiscall
Js::PathTypeHandlerBase::ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>
          (PathTypeHandlerBase *this,DynamicObject *instance)

{
  byte bVar1;
  Type TVar2;
  ScriptContext *scriptContext;
  Recycler *this_00;
  DynamicType *oldType;
  code *pcVar3;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar4;
  bool bVar5;
  byte bVar6;
  bool usedAsFixed;
  PropertyTypes values;
  unsigned_short uVar7;
  int iVar8;
  undefined4 *puVar9;
  Recycler *alloc;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar10;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  RecyclerWeakReference<Js::DynamicObject> *pRVar11;
  undefined4 extraout_var;
  PropertyRecord *propertyRecord;
  char *pcVar13;
  Type *nextPropertyIndex;
  TypePath *pTVar14;
  ulong uVar15;
  PathTypeHandlerBase *this_01;
  bool isInitialized;
  undefined1 local_d0 [8];
  TrackAllocData data;
  int i;
  DictionaryPropertyDescriptor<unsigned_short> *local_70;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  long local_60;
  TypePath *local_58;
  PathTypeHandlerBase *local_50;
  uint local_44;
  ES5ArrayTypeHandlerBase<unsigned_short> *local_40;
  char local_31;
  long lVar12;
  
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x596,"(instance)","instance");
    if (!bVar5) goto LAB_00dd9298;
    *puVar9 = 0;
  }
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = scriptContext->recycler;
  (*(instance->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x68])(instance);
  bVar5 = DynamicObject::DeoptimizeObjectHeaderInlining(instance);
  local_50 = this;
  if (bVar5) {
    local_50 = (PathTypeHandlerBase *)DynamicObject::GetTypeHandler(instance);
  }
  if (local_50 == (PathTypeHandlerBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5ae,"(oldTypeHandler)","oldTypeHandler");
    if (!bVar5) goto LAB_00dd9298;
    *puVar9 = 0;
  }
  this_01 = local_50;
  local_d0 = (undefined1  [8])&ES5ArrayTypeHandlerBase<unsigned_short>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9d33d42;
  data.filename._0_4_ = 0x5b0;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_d0);
  pEVar10 = (ES5ArrayTypeHandlerBase<unsigned_short> *)new<Memory::Recycler>(0x40,alloc,0x38bbb2);
  ES5ArrayTypeHandlerBase<unsigned_short>::ES5ArrayTypeHandlerBase
            (pEVar10,this_00,(this_01->super_DynamicTypeHandler).slotCapacity,
             (this_01->super_DynamicTypeHandler).inlineSlotCapacity,
             (this_01->super_DynamicTypeHandler).offsetOfInlineSlots);
  bVar6 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)pEVar10);
  local_40 = pEVar10;
  if ((bVar6 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5b2,"(newTypeHandler->GetHasOnlyWritableDataProperties())",
                                "newTypeHandler->GetHasOnlyWritableDataProperties()");
    if (!bVar5) goto LAB_00dd9298;
    *puVar9 = 0;
  }
  pEVar10 = local_40;
  oldType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  bVar5 = HasSingletonInstance(this_01);
  if (bVar5) {
    oldSingletonInstanceBefore = (((this_01->typePath).ptr)->singletonInstance).ptr;
  }
  else {
    oldSingletonInstanceBefore = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  }
  pcVar13 = (char *)instance;
  TraceFixedFieldsBeforeTypeHandlerChange
            (L"converting",L"PathTypeHandler",L"DictionaryTypeHandler",instance,
             &this_01->super_DynamicTypeHandler,oldType,oldSingletonInstanceBefore);
  local_31 = DynamicTypeHandler::CanBeSingletonInstance(instance);
  if ((!(bool)local_31) && (bVar5 = HasSingletonInstance(this_01), bVar5)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    pcVar13 = "canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance()";
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5bd,
                                "(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance())"
                                ,"canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance()"
                               );
    if (!bVar5) goto LAB_00dd9298;
    *puVar9 = 0;
    pEVar10 = local_40;
  }
  bVar5 = DynamicTypeHandler::ShouldFixAnyProperties();
  if ((!bVar5) &&
     ((((this_01->typePath).ptr)->singletonInstance).ptr !=
      (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    pcVar13 = "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()";
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5c9,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
    if (!bVar5) goto LAB_00dd9298;
    *puVar9 = 0;
    pEVar10 = local_40;
  }
  if ((local_31 != '\0') && (bVar5 = DynamicTypeHandler::ShouldFixAnyProperties(), bVar5)) {
    pRVar11 = (((this_01->typePath).ptr)->singletonInstance).ptr;
    if ((pRVar11 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
       ((DynamicObject *)(pRVar11->super_RecyclerWeakReferenceBase).strongRef != instance)) {
      pRVar11 = DynamicObject::CreateWeakReferenceToSelf(instance);
    }
    DynamicTypeHandler::SetSingletonInstance((DynamicTypeHandler *)pEVar10,pRVar11);
  }
  if ((DAT_015d6345 == '\x01') && (((this_01->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    pcVar13 = 
    "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
    ;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5df,
                                "(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar5) goto LAB_00dd9298;
    *puVar9 = 0;
    pEVar10 = local_40;
  }
  bVar6 = (this_01->super_DynamicTypeHandler).flags;
  local_44 = (uint)CONCAT71((int7)((ulong)pcVar13 >> 8),1);
  if ((bVar6 & 0x20) == 0) {
    if ((bVar6 & 0x18) == 0) {
      local_44 = 0;
    }
    else {
      local_44 = (uint)CONCAT71(0x15aa2,DAT_015d6345) ^ 1;
    }
  }
  iVar8 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
  lVar12 = CONCAT44(extraout_var,iVar8);
  if (1 < (this_01->super_DynamicTypeHandler).unusedBytes) {
    pTVar14 = (this_01->typePath).ptr;
    descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)__tls_get_addr(&PTR_0155fe48);
    nextPropertyIndex =
         &(pEVar10->super_DictionaryTypeHandlerBase<unsigned_short>).nextPropertyIndex;
    uVar15 = 0;
    local_60 = lVar12;
    local_58 = pTVar14;
    do {
      if (lVar12 == 0) {
        bVar6 = 7;
      }
      else {
        bVar6 = *(byte *)(lVar12 + uVar15);
      }
      if (uVar15 < ((pTVar14->data).ptr)->pathLength) {
        propertyRecord = TypePath::GetPropertyIdUnchecked(pTVar14,(int)uVar15);
      }
      else {
        propertyRecord = (PropertyRecord *)0x0;
      }
      pEVar10 = local_40;
      local_d0 = (undefined1  [8])propertyRecord;
      if (bVar6 == 0xf7) {
        bVar5 = JsUtil::
                BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::TryGetReference<Js::PropertyRecord_const*>
                          ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                            *)(local_40->super_DictionaryTypeHandlerBase<unsigned_short>).
                              propertyMap.ptr,(PropertyRecord **)local_d0,&local_70,
                           (int *)&data.field_0x24);
        pTVar14 = local_58;
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          pDVar4 = descriptor;
          pDVar4->flags = PreventFalseReference;
          pDVar4->Attributes = '\0';
          pDVar4->Data = 0;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x5ef,"(result)","result");
          if (!bVar5) goto LAB_00dd9298;
          pDVar4->flags = None;
          pDVar4->Attributes = '\0';
          pDVar4->Data = 0;
          lVar12 = local_60;
        }
        uVar7 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(local_70);
        if ((*(byte *)(lVar12 + (ulong)uVar7) & 0x10) == 0) {
          if (uVar15 != (pEVar10->super_DictionaryTypeHandlerBase<unsigned_short>).nextPropertyIndex
             ) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pDVar4 = descriptor;
            pDVar4->flags = PreventFalseReference;
            pDVar4->Attributes = '\0';
            pDVar4->Data = 0;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                        ,0x5f4,"(i == newTypeHandler->nextPropertyIndex)",
                                        "i == newTypeHandler->nextPropertyIndex");
            if (!bVar5) goto LAB_00dd9298;
            pDVar4->flags = None;
            pDVar4->Attributes = '\0';
            pDVar4->Data = 0;
            lVar12 = local_60;
          }
          TVar2 = (pEVar10->super_DictionaryTypeHandlerBase<unsigned_short>).nextPropertyIndex;
          if (TVar2 == 0xffff) {
            ::Math::DefaultOverflowPolicy();
          }
          (pEVar10->super_DictionaryTypeHandlerBase<unsigned_short>).nextPropertyIndex = TVar2 + 1;
        }
        else {
          uVar7 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                            (local_70);
          iVar8 = (*(this_01->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x70])
                            (this_01,(ulong)uVar7);
          if (*nextPropertyIndex != ((ushort)iVar8 & 0xff)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pDVar4 = descriptor;
            pDVar4->flags = PreventFalseReference;
            pDVar4->Attributes = '\0';
            pDVar4->Data = 0;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                        ,0x5f8,
                                        "(oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex)"
                                        ,
                                        "oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex"
                                       );
            if (!bVar5) goto LAB_00dd9298;
            pDVar4->flags = None;
            pDVar4->Attributes = '\0';
            pDVar4->Data = 0;
            lVar12 = local_60;
          }
          DictionaryPropertyDescriptor<unsigned_short>::ConvertToGetterSetter
                    (local_70,nextPropertyIndex);
          DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)pEVar10,false);
        }
      }
      else {
        if (DAT_015d6361 == '\x01') {
          bVar1 = ((local_58->data).ptr)->maxInitializedLength;
          if (local_31 == '\0') {
            bVar5 = false;
          }
          else {
            bVar5 = TypePath::GetIsFixedFieldAt
                              (local_58,(PropertyIndex)uVar15,
                               (uint)((local_50->super_DynamicTypeHandler).unusedBytes >> 1));
          }
          if ((char)local_44 == '\0') {
            usedAsFixed = false;
          }
          else {
            usedAsFixed = TypePath::GetIsUsedFixedFieldAt
                                    (local_58,(PropertyIndex)uVar15,
                                     (uint)((local_50->super_DynamicTypeHandler).unusedBytes >> 1));
          }
          isInitialized = uVar15 < bVar1;
        }
        else {
          isInitialized = true;
          bVar5 = false;
          usedAsFixed = false;
        }
        pEVar10 = local_40;
        DictionaryTypeHandlerBase<unsigned_short>::Add
                  (&local_40->super_DictionaryTypeHandlerBase<unsigned_short>,propertyRecord,
                   bVar6 & 0xf,isInitialized,bVar5,usedAsFixed,scriptContext);
        pTVar14 = local_58;
        this_01 = local_50;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (this_01->super_DynamicTypeHandler).unusedBytes >> 1);
  }
  if (DAT_015d6361 != '\0') {
    bVar5 = DynamicTypeHandler::ShouldFixAnyProperties();
    if ((!bVar5) &&
       ((((this_01->typePath).ptr)->singletonInstance).ptr !=
        (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x616,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                  "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar5) goto LAB_00dd9298;
      *puVar9 = 0;
      pEVar10 = local_40;
    }
    pTVar14 = (this_01->typePath).ptr;
    pRVar11 = (pTVar14->singletonInstance).ptr;
    if ((pRVar11 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       ((DynamicObject *)(pRVar11->super_RecyclerWeakReferenceBase).strongRef == instance)) {
      (pTVar14->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
  }
  if ((DAT_015d6345 == '\x01') && (((this_01->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x61d,
                                "(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar5) goto LAB_00dd9298;
    *puVar9 = 0;
    pEVar10 = local_40;
  }
  if (((pEVar10->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.flags &
      0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x61e,"(!newTypeHandler->GetIsPrototype())",
                                "Why did we create a brand new type handler with a prototype flag set?"
                               );
    if (!bVar5) goto LAB_00dd9298;
    *puVar9 = 0;
    pEVar10 = local_40;
  }
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)pEVar10,(this_01->super_DynamicTypeHandler).flags & 0x20);
  if (((pEVar10->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.
       propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x623,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar5) goto LAB_00dd9298;
    *puVar9 = 0;
    pEVar10 = local_40;
  }
  values = DynamicTypeHandler::GetPropertyTypes(&this_01->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)pEVar10,0xb0,values);
  ES5ArrayTypeHandlerBase<unsigned_short>::SetInstanceTypeHandler(pEVar10,instance,true);
  pcVar13 = (char *)pEVar10;
  bVar5 = DictionaryTypeHandlerBase<unsigned_short>::HasSingletonInstance
                    (&pEVar10->super_DictionaryTypeHandlerBase<unsigned_short>);
  if ((bVar5) && (pcVar13 = (char *)instance, bVar5 = DynamicObject::HasSharedType(instance), bVar5)
     ) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    pcVar13 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
    ;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x628,
                                "(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType())"
                                ,
                                "!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType()"
                               );
    if (!bVar5) {
LAB_00dd9298:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
    pEVar10 = local_40;
  }
  TraceFixedFieldsAfterTypeHandlerChange
            ((DynamicObject *)pcVar13,&this_01->super_DynamicTypeHandler,
             (DynamicTypeHandler *)pEVar10,oldType,
             (DynamicType *)(instance->super_RecyclableObject).type.ptr,oldSingletonInstanceBefore);
  return pEVar10;
}

Assistant:

T* PathTypeHandlerBase::ConvertToTypeHandler(DynamicObject* instance)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        instance->PrepareForConversionToNonPathType();

        PathTypeHandlerBase * oldTypeHandler;

        // Ideally 'this' and oldTypeHandler->GetTypeHandler() should be same
        // But we can have calls from external DOM objects, which requests us to replace the type of the
        // object with a new type. And in such cases, this API gets called with oldTypeHandler and the
        // new type (obtained from the External DOM object)
        // We use the duplicated typeHandler, if we deOptimized the object successfully, else we retain the earlier
        // behavior of using 'this' pointer.

        if (instance->DeoptimizeObjectHeaderInlining())
        {
            oldTypeHandler = reinterpret_cast<PathTypeHandlerBase *>(instance->GetTypeHandler());
        }
        else
        {
            oldTypeHandler = this;
        }

        Assert(oldTypeHandler);

        T* newTypeHandler = RecyclerNew(recycler, T, recycler, oldTypeHandler->GetSlotCapacity(), oldTypeHandler->GetInlineSlotCapacity(), oldTypeHandler->GetOffsetOfInlineSlots());
        // We expect the new type handler to start off marked as having only writable data properties.
        Assert(newTypeHandler->GetHasOnlyWritableDataProperties());

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = oldTypeHandler->GetSingletonInstance();
        oldTypeHandler->TraceFixedFieldsBeforeTypeHandlerChange(_u("converting"), _u("PathTypeHandler"), _u("DictionaryTypeHandler"), instance, oldTypeHandler, oldType, oldSingletonInstance);
#endif

        bool const canBeSingletonInstance = DynamicTypeHandler::CanBeSingletonInstance(instance);
        // If this type had been installed on a stack instance it shouldn't have a singleton Instance
        Assert(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance());

        // This instance may not be the singleton instance for this handler. There may be a singleton at the tip
        // and this instance may be getting initialized via an object literal and one of the properties may
        // be an accessor.  In this case we will convert to a DictionaryTypeHandler and it's correct to
        // transfer this instance, even tough different from the singleton. Ironically, this instance
        // may even appear to be at the tip along with the other singleton, because the set of properties (by
        // name, not value) may be identical.
        // Consider: Consider threading PropertyOperation_Init through InitProperty and SetAccessors,
        // to be sure that we don't assert only in this narrow case.
        // Assert(this->typePath->GetSingletonInstance() == instance);

        Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());

        // Don't install stack instance as singleton instance
        if (canBeSingletonInstance)
        {
            if (DynamicTypeHandler::AreSingletonInstancesNeeded())
            {
                RecyclerWeakReference<DynamicObject>* curSingletonInstance = oldTypeHandler->GetTypePath()->GetSingletonInstance();
                if (curSingletonInstance != nullptr && curSingletonInstance->Get() == instance)
                {
                    newTypeHandler->SetSingletonInstance(curSingletonInstance);
                }
                else
                {
                    newTypeHandler->SetSingletonInstance(instance->CreateWeakReferenceToSelf());
                }
            }
        }

        bool transferFixed = canBeSingletonInstance;

        // If we are a prototype or may become a prototype we must transfer used as fixed bits.  See point 4 in ConvertToSimpleDictionaryType.
        Assert(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        bool transferUsedAsFixed = ((oldTypeHandler->GetFlags() & IsPrototypeFlag) != 0 || (oldTypeHandler->GetIsOrMayBecomeShared() && !DynamicTypeHandler::IsolatePrototypes()));
#endif

        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        TypePath * typePath = oldTypeHandler->GetTypePath();
        for (PropertyIndex i = 0; i < oldTypeHandler->GetPathLength(); i++)
        {
            ObjectSlotAttributes attr = attributes ? attributes[i] : ObjectSlotAttr_Default;
            const PropertyRecord * propertyRecord = typePath->GetPropertyId(i);
            if (attr == ObjectSlotAttr_Setter)
            {
                // Adding a setter. Don't add another descriptor. Find the getter and convert its descriptor, which will cause
                // the setter to get the next free slot.
                DictionaryPropertyDescriptor<PropertyIndex> *descriptor;
                bool result = newTypeHandler->propertyMap->TryGetReference(propertyRecord, &descriptor);
                Assert(result);
                if (!(attributes[descriptor->GetDataPropertyIndex<false>()] & ObjectSlotAttr_Accessor))
                {
                    // Setter without a getter; this is a stale entry, so ignore it
                    // Just consume the slot so no descriptor refers to it.
                    Assert(i == newTypeHandler->nextPropertyIndex);
                    ::Math::PostInc(newTypeHandler->nextPropertyIndex);
                    continue;
                }
                Assert(oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex);
                descriptor->ConvertToGetterSetter(newTypeHandler->nextPropertyIndex);
                newTypeHandler->ClearHasOnlyWritableDataProperties();
            }
            else
            {
#if ENABLE_FIXED_FIELDS
                // Consider: As noted in point 2 in ConvertToSimpleDictionaryType, when converting to non-shared handler we could be more
                // aggressive and mark every field as fixed, because we will always take a type transition. We have to remember to respect
                // the switches as to which kinds of properties we should fix, and for that we need the values from the instance. Even if
                // the type handler says the property is initialized, the current instance may not have a value for it. Check for value != null.
                if (PathTypeHandlerBase::FixPropsOnPathTypes())
                {
                    newTypeHandler->Add(propertyRecord, ObjectSlotAttributesToPropertyAttributes(attr),
                        i < typePath->GetMaxInitializedLength(),
                        transferFixed && typePath->GetIsFixedFieldAt(i, oldTypeHandler->GetPathLength()),
                        transferUsedAsFixed && typePath->GetIsUsedFixedFieldAt(i, oldTypeHandler->GetPathLength()),
                        scriptContext);
                }
                else
#endif
                {
                    newTypeHandler->Add(propertyRecord, ObjectSlotAttributesToPropertyAttributes(attr), true, false, false, scriptContext);
                }
            }
        }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        if (PathTypeHandlerBase::FixPropsOnPathTypes())
        {
            Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());
            oldTypeHandler->GetTypePath()->ClearSingletonInstanceIfSame(instance);
        }
#endif

        // PathTypeHandlers are always shared, so if we're isolating prototypes, a PathTypeHandler should
        // never have the prototype flag set.
        Assert(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        AssertMsg(!newTypeHandler->GetIsPrototype(), "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, oldTypeHandler->GetFlags());

        // Any new type handler we expect to see here should have inline slot capacity locked.  If this were to change, we would need
        // to update our shrinking logic (see ShrinkSlotAndInlineSlotCapacity).
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, oldTypeHandler->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS
        Assert(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        PathTypeHandlerBase::TraceFixedFieldsAfterTypeHandlerChange(instance, oldTypeHandler, newTypeHandler, oldType, instance->GetDynamicType(), oldSingletonInstance);
#endif
#endif

        return newTypeHandler;
    }